

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

int OpenMD::findBegin(istream *theStream,char *startText)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  char *the_token;
  int lineNum;
  int foundText;
  char readLine [1024];
  int MAXLEN;
  uint local_430;
  char local_428 [1036];
  undefined4 local_1c;
  char *local_18;
  char *local_10;
  uint local_4;
  
  local_1c = 0x400;
  bVar4 = false;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::istream::seekg((long)in_RDI,_S_beg);
  uVar2 = std::ios::eof();
  if ((uVar2 & 1) == 0) {
    std::istream::getline(local_10,(long)local_428);
    local_430 = 1;
    while (!bVar4) {
      uVar2 = std::ios::eof();
      if ((uVar2 & 1) != 0) {
        printf("Error fast forwarding stream at line %d: stream ended unexpectedly.\n",
               (ulong)local_430);
        return -1;
      }
      pcVar3 = strtok(local_428," ,;\t");
      if (((pcVar3 != (char *)0x0) && (iVar1 = strcasecmp("begin",pcVar3), iVar1 == 0)) &&
         (pcVar3 = strtok((char *)0x0," ,;\t"), pcVar3 != (char *)0x0)) {
        iVar1 = strcasecmp(local_18,pcVar3);
        bVar4 = iVar1 == 0;
      }
      if (!bVar4) {
        uVar2 = std::ios::eof();
        if ((uVar2 & 1) != 0) {
          printf("Error fast forwarding stream at line %d: stream ended unexpectedly.\n",
                 (ulong)local_430);
          return -1;
        }
        std::istream::getline(local_10,(long)local_428);
        local_430 = local_430 + 1;
      }
    }
    local_4 = local_430;
  }
  else {
    printf("Error fast forwarding stream: stream is empty.\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int findBegin(std::istream& theStream, const char* startText) {
    const int MAXLEN = 1024;
    char readLine[MAXLEN];
    int foundText = 0;
    int lineNum;
    char* the_token;

    // rewind the stream
    theStream.seekg(0, std::ios::beg);
    lineNum = 0;

    if (!theStream.eof()) {
      theStream.getline(readLine, MAXLEN);
      lineNum++;
    } else {
      printf("Error fast forwarding stream: stream is empty.\n");
      return -1;
    }

    while (!foundText) {
      if (theStream.eof()) {
        printf("Error fast forwarding stream at line %d: "
               "stream ended unexpectedly.\n",
               lineNum);
        return -1;
      }

      the_token = strtok(readLine, " ,;\t");
      if (the_token != NULL)
        if (!strcasecmp("begin", the_token)) {
          the_token = strtok(NULL, " ,;\t");
          if (the_token != NULL) {
            foundText = !strcasecmp(startText, the_token);
          }
        }

      if (!foundText) {
        if (!theStream.eof()) {
          theStream.getline(readLine, MAXLEN);
          lineNum++;
        } else {
          printf("Error fast forwarding stream at line %d: "
                 "stream ended unexpectedly.\n",
                 lineNum);
          return -1;
        }
      }
    }
    return lineNum;
  }